

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void TestForeignDiscard(void)

{
  data_type *data;
  _Alloc_hider data_00;
  size_type size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a1;
  shared_count *psVar1;
  OutputBuffer buf;
  undefined4 local_22c;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  size_type local_208;
  string there;
  string world;
  string again;
  string hello;
  string local_180 [32];
  string local_160 [32];
  undefined1 local_140 [40];
  undefined1 local_118 [40];
  char *local_f0;
  char *local_e8;
  const_string local_e0;
  const_string local_d0;
  char *local_c0;
  char *local_b8;
  const_string local_b0;
  const_string local_a0;
  char *local_90;
  char *local_88;
  const_string local_80;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  
  again._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  again._M_string_length =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + 0x6d;
  again.field_2._M_allocated_capacity = 0x42c;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&again);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  there._M_dataplus._M_p._0_1_ = 1;
  hello._M_string_length._0_1_ = 0;
  hello._M_dataplus._M_p = "lp\x1b";
  hello.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  hello.field_2._8_8_ = anon_var_dwarf_9116b;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&there,(lazy_ostream *)&hello);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&there);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hello,"hello ",(allocator<char> *)&again);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&again,"again ",(allocator<char> *)&there);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&there,"there ",(allocator<char> *)&world);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&world,"world ",(allocator<char> *)local_228);
  avro::OutputBuffer::OutputBuffer(&buf,0);
  avro::detail::BufferImpl::writeTo
            (buf.pimpl_.px,hello._M_dataplus._M_p,
             CONCAT71(hello._M_string_length._1_7_,(undefined1)hello._M_string_length));
  size = again._M_string_length;
  data_00 = again._M_dataplus;
  std::__cxx11::string::string(local_160,(string *)&again);
  boost::bind<void,std::__cxx11::string_const&,std::__cxx11::string>
            ((bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_118,(boost *)deleteForeign,
             (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             local_160,in_RCX);
  boost::function<void()>::
  function<boost::_bi::bind_t<void,void(*)(std::__cxx11::string_const&),boost::_bi::list1<boost::_bi::value<std::__cxx11::string>>>>
            ((function<void()> *)local_228,
             (bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_118,0);
  a1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228;
  avro::detail::BufferImpl::appendForeignData(buf.pimpl_.px,data_00._M_p,size,(free_func *)a1);
  boost::function0<void>::~function0((function0<void> *)local_228);
  std::__cxx11::string::~string((string *)(local_118 + 8));
  std::__cxx11::string::~string(local_160);
  data = (data_type *)CONCAT71(there._M_dataplus._M_p._1_7_,there._M_dataplus._M_p._0_1_);
  std::__cxx11::string::string(local_180,(string *)&there);
  boost::bind<void,std::__cxx11::string_const&,std::__cxx11::string>
            ((bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_140,(boost *)deleteForeign,
             (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             local_180,a1);
  boost::function<void()>::
  function<boost::_bi::bind_t<void,void(*)(std::__cxx11::string_const&),boost::_bi::list1<boost::_bi::value<std::__cxx11::string>>>>
            ((function<void()> *)local_228,
             (bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_140,0);
  avro::detail::BufferImpl::appendForeignData
            (buf.pimpl_.px,data,there._M_string_length,(free_func *)local_228);
  boost::function0<void>::~function0((function0<void> *)local_228);
  std::__cxx11::string::~string((string *)(local_140 + 8));
  std::__cxx11::string::~string(local_180);
  avro::detail::BufferImpl::writeTo(buf.pimpl_.px,world._M_dataplus._M_p,world._M_string_length);
  avro::InputBuffer::InputBuffer((InputBuffer *)local_228,&buf);
  printBuffer((InputBuffer *)local_228);
  psVar1 = (shared_count *)(local_228 + 8);
  boost::detail::shared_count::~shared_count(psVar1);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,&local_40,0x43a,&local_50);
  local_228[8] = '\0';
  local_228._0_8_ = &PTR__lazy_ostream_001ea848;
  local_218._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_218._8_8_ = (long)"\t" + 1;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_58 = "";
  local_208 = (buf.pimpl_.px)->size_;
  local_22c = 0x18;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_228,&local_60,0x43a,1,2,&local_208,"buf.size()",&local_22c,"24U");
  avro::OutputBuffer::discardData(&buf,9);
  avro::InputBuffer::InputBuffer((InputBuffer *)local_228,&buf);
  printBuffer((InputBuffer *)local_228);
  psVar1 = (shared_count *)(local_228 + 8);
  boost::detail::shared_count::~shared_count(psVar1);
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,&local_70,0x43f,&local_80);
  local_228[8] = '\0';
  local_228._0_8_ = &PTR__lazy_ostream_001ea848;
  local_218._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_218._8_8_ = (long)"\t" + 1;
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88 = "";
  local_208 = (buf.pimpl_.px)->size_;
  local_22c = 0xf;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_228,&local_90,0x43f,1,2,&local_208,"buf.size()",&local_22c,"15U");
  safeToDelete = true;
  avro::OutputBuffer::discardData(&buf,6);
  safeToDelete = false;
  avro::InputBuffer::InputBuffer((InputBuffer *)local_228,&buf);
  printBuffer((InputBuffer *)local_228);
  psVar1 = (shared_count *)(local_228 + 8);
  boost::detail::shared_count::~shared_count(psVar1);
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_a0.m_end = "";
  local_b0.m_begin = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,&local_a0,0x446,&local_b0);
  local_228[8] = '\0';
  local_228._0_8_ = &PTR__lazy_ostream_001ea848;
  local_218._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_218._8_8_ = (long)"\t" + 1;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_b8 = "";
  local_208 = (buf.pimpl_.px)->size_;
  local_22c = 9;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_228,&local_c0,0x446,1,2,&local_208,"buf.size()",&local_22c,"9U");
  safeToDelete = true;
  avro::OutputBuffer::discardData(&buf,3);
  safeToDelete = false;
  avro::InputBuffer::InputBuffer((InputBuffer *)local_228,&buf);
  printBuffer((InputBuffer *)local_228);
  psVar1 = (shared_count *)(local_228 + 8);
  boost::detail::shared_count::~shared_count(psVar1);
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_d0.m_end = "";
  local_e0.m_begin = "";
  local_e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,&local_d0,0x44d,&local_e0);
  local_228[8] = '\0';
  local_228._0_8_ = &PTR__lazy_ostream_001ea848;
  local_218._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_218._8_8_ = (long)"\t" + 1;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_e8 = "";
  local_208 = (buf.pimpl_.px)->size_;
  local_22c = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_228,&local_f0,0x44d,1,2,&local_208,"buf.size()",&local_22c,"6U");
  boost::detail::shared_count::~shared_count(&buf.pimpl_.pn);
  std::__cxx11::string::~string((string *)&world);
  std::__cxx11::string::~string((string *)&there);
  std::__cxx11::string::~string((string *)&again);
  std::__cxx11::string::~string((string *)&hello);
  return;
}

Assistant:

void TestForeignDiscard ()  
{
    BOOST_TEST_MESSAGE( "TestForeign");
    {
        std::string hello = "hello ";
        std::string again = "again ";
        std::string there = "there ";
        std::string world = "world ";

        OutputBuffer buf;
        buf.writeTo(hello.c_str(), hello.size());
        buf.appendForeignData(again.c_str(), again.size(), boost::bind(&deleteForeign, again));
        buf.appendForeignData(there.c_str(), there.size(), boost::bind(&deleteForeign, there));
        buf.writeTo(world.c_str(), world.size());
        
        printBuffer(buf);
        BOOST_CHECK_EQUAL(buf.size(), 24U);

        // discard some data including half the foreign buffer
        buf.discardData(9);
        printBuffer(buf);
        BOOST_CHECK_EQUAL(buf.size(), 15U);
        
        // discard some more data, which will lop off the first foreign buffer
        safeToDelete = true;
        buf.discardData(6);
        safeToDelete = false;
        printBuffer(buf);
        BOOST_CHECK_EQUAL(buf.size(), 9U);

        // discard some more data, which will lop off the second foreign buffer
        safeToDelete = true;
        buf.discardData(3);
        safeToDelete = false;
        printBuffer(buf);
        BOOST_CHECK_EQUAL(buf.size(), 6U);
    }
}